

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O3

void proto2_unittest::TestNestedMessageEnum::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  _func_int **pp_Var2;
  Arena *extraout_RDX;
  Arena *arena;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar3;
  Arena *arena_00;
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar3 = from_msg;
    MergeImpl();
    arena = extraout_RDX;
LAB_00d05357:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
LAB_00d052d5:
    google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar3,value,arena);
  }
  else {
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)&to_msg[1]._internal_metadata_,
               (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 3) == 0) goto LAB_00d05305;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[2]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      pMVar3 = (MessageLite *)&to_msg[2]._internal_metadata_;
      arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)arena & 1) != 0) goto LAB_00d05357;
      goto LAB_00d052d5;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pMVar3 = (MessageLite *)from_msg[3]._vptr_MessageLite;
    if (pMVar3 == (MessageLite *)0x0) {
      MergeImpl((TestNestedMessageEnum *)&stack0xffffffffffffffd0);
    }
    if ((MessageLite *)to_msg[3]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var2 = (_func_int **)
                google::protobuf::Arena::CopyConstruct<proto2_unittest::TestMessageEnum>
                          (arena_00,pMVar3);
      to_msg[3]._vptr_MessageLite = pp_Var2;
    }
    else {
      TestMessageEnum::MergeImpl((MessageLite *)to_msg[3]._vptr_MessageLite,pMVar3);
    }
  }
LAB_00d05305:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestNestedMessageEnum::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestNestedMessageEnum*>(&to_msg);
  auto& from = static_cast<const TestNestedMessageEnum&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestNestedMessageEnum)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_direct_enum()->MergeFrom(from._internal_direct_enum());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_redacted_string(from._internal_redacted_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.nested_enum_ != nullptr);
      if (_this->_impl_.nested_enum_ == nullptr) {
        _this->_impl_.nested_enum_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.nested_enum_);
      } else {
        _this->_impl_.nested_enum_->MergeFrom(*from._impl_.nested_enum_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}